

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,TagVar *arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  ushort uVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  expected<const_Command::Arg_*,_Commands::MatchFailure> *extraout_RAX;
  expected<const_Command::Arg_*,_Commands::MatchFailure> *extraout_RAX_00;
  element_type *peVar6;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  runtime_error *this;
  uint uVar7;
  char *__function;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined8 uVar9;
  optional<shared_ptr<Var>_> opt_var;
  optional<shared_ptr<Var>_> opt_varidx;
  optional<int32_t> opt_const;
  expected<Miss2Identifier,_Miss2Identifier::Error> opt_token;
  optional<std::pair<string_view,_bool>_> var_ident;
  optional<shared_ptr<Var>_> local_d0;
  optional<shared_ptr<Var>_> local_b8;
  Options *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  undefined1 local_80 [24];
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
  local_68;
  undefined1 local_50 [32];
  
  local_a0 = options;
  local_98._8_8_ = commands;
  bVar4 = Miss2Identifier::is_identifier(&arg->ident,options);
  if (!bVar4) {
    peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var8 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = InvalidIdentifier;
      return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
        goto LAB_001653d9;
      }
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
LAB_001653d9:
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var8;
    (__return_storage_ptr__->contained).m_error.reason = InvalidIdentifier;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    return extraout_RAX;
  }
  maybe_var_identifier
            ((optional<std::pair<string_view,_bool>_> *)local_50,&arg->ident,
             (Arg *)(ulong)*(uint *)arginfo);
  if (local_50[0] == true) {
    Miss2Identifier::match
              ((expected<Miss2Identifier,_Miss2Identifier::Error> *)local_88,
               (string_view *)(local_50 + 8),local_a0);
    if (local_88[0] == false) {
      switch(local_80._0_4_) {
      case 0:
        goto switchD_0016539d_caseD_0;
      case 1:
        peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (__shared_count<(__gnu_cxx::_Lock_policy)2>)
             (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNesting;
          return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
          UNLOCK();
          if (__libc_single_threaded != '\0') goto LAB_001657a3;
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
LAB_001657a3:
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNesting;
        goto LAB_001654ab;
      case 2:
        peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (__shared_count<(__gnu_cxx::_Lock_policy)2>)
             (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNegative;
          return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
          UNLOCK();
          if (__libc_single_threaded != '\0') goto LAB_0016572e;
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
LAB_0016572e:
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNegative;
        goto LAB_001654ab;
      case 3:
        peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (__shared_count<(__gnu_cxx::_Lock_policy)2>)
             (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexOutOfRange;
          return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
          UNLOCK();
          if (__libc_single_threaded != '\0') goto LAB_00165755;
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
LAB_00165755:
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
               + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexOutOfRange;
        goto LAB_001654ab;
      default:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,
                   "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(309)."
                  );
        *(undefined ***)this = &PTR__runtime_error_00215638;
        __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    SymTable::find_var(&local_d0,symtable,(string_view *)local_80,scope_ptr);
    if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.init_ == true) {
      if (((bool)local_80[0x10] == true) &&
         (bVar4 = eggs::variants::detail::
                  apply<bool,is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>(eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>,false,true>const&>
                            ((anon_class_1_0_00000001 *)&local_b8,&local_68), bVar4)) {
        if ((local_80[0x10] & 1) != 0) {
          if (local_68.
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
              ._which != 1) {
            eggs::variants::detail::throw_bad_variant_access<unsigned_long&>();
          }
          bVar4 = true;
          bVar3 = true;
          uVar9 = local_68.
                  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
                  .
                  super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                  .field_0._0_8_;
          goto LAB_001654c7;
        }
LAB_00165d30:
        __function = 
        "T &std::experimental::optional<eggs::variants::variant<unsigned long, libcxx_strviewclone::basic_string_view<char>>>::operator*() & [T = eggs::variants::variant<unsigned long, libcxx_strviewclone::basic_string_view<char>>]"
        ;
        goto LAB_00165d45;
      }
      bVar4 = false;
      bVar3 = false;
      uVar9 = 0;
LAB_001654c7:
      if ((local_80[0x10] & 1) == 0) {
LAB_001654ed:
        if ((local_80[0x10] & 1) != 0) goto LAB_001658e4;
        if ((local_d0.super_OptionalBase<std::shared_ptr<Var>_>.init_ & 1U) != 0) {
          if (((local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count).
              super_OptionalBase<unsigned_int>.init_ != true) goto LAB_001658e4;
          peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
          if (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (__return_storage_ptr__->contained).m_error.reason = ExpectedVarIndex;
            goto LAB_00165c56;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded != '\0') goto LAB_0016589d;
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
LAB_0016589d:
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (__return_storage_ptr__->contained).m_error.reason = ExpectedVarIndex;
          goto LAB_00165c51;
        }
      }
      else {
        bVar5 = eggs::variants::detail::
                apply<bool,is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>(eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>,false,true>const&>
                          ((anon_class_1_0_00000001 *)&local_b8,&local_68);
        if (bVar5) goto LAB_001654ed;
        if ((local_80[0x10] & 1) == 0) goto LAB_00165d30;
        if (local_68.
            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
            ._which != 2) {
          eggs::variants::detail::
          throw_bad_variant_access<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>
                    ();
        }
        SymTable::find_var(&local_b8,symtable,(string_view *)&local_68,scope_ptr);
        if ((anon_class_1_0_00000001)local_b8.super_OptionalBase<std::shared_ptr<Var>_>.init_ !=
            (anon_class_1_0_00000001)0x1) {
          Commands::find_constant_all((Commands *)local_98,(string_view *)local_98._8_8_);
          if (local_98[0] == '\x01') {
            if (local_a0->pedantic != true) {
              bVar3 = true;
              if (bVar4) {
                bVar3 = bVar4;
              }
              uVar9 = SEXT48((int)local_98._4_4_);
              goto LAB_001658cd;
            }
            peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            p_Var8 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
              (__return_storage_ptr__->contained).m_error.context.
              super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsConstant;
              goto LAB_00165c40;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_00165bdc;
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
LAB_00165bdc:
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 p_Var8;
            (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsConstant;
          }
          else {
            peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            p_Var8 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
              (__return_storage_ptr__->contained).m_error.context.
              super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotVar;
              goto LAB_00165c40;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_00165b2a;
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
LAB_00165b2a:
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 p_Var8;
            (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotVar;
          }
LAB_00165c3b:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          peVar6 = extraout_RAX_01;
LAB_00165c40:
          if (((anon_class_1_0_00000001)local_b8.super_OptionalBase<std::shared_ptr<Var>_>.init_ ==
               (anon_class_1_0_00000001)0x1) &&
             (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) goto LAB_00165c51;
          goto LAB_00165c56;
        }
        if ((local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type != Int) {
          peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var8 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_00165acd;
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
LAB_00165acd:
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 p_Var8;
            (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotInt;
            goto LAB_00165c3b;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotInt;
          goto LAB_00165c40;
        }
        if (((local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count).
            super_OptionalBase<unsigned_int>.init_ == true) {
          peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var8 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsArray;
            goto LAB_00165c40;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded != '\0') goto LAB_00165c26;
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
LAB_00165c26:
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var8;
          (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsArray;
          goto LAB_00165c3b;
        }
LAB_001658cd:
        if (((local_b8.super_OptionalBase<std::shared_ptr<Var>_>.init_ & 1U) != 0) &&
           (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                     super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
LAB_001658e4:
        if ((local_d0.super_OptionalBase<std::shared_ptr<Var>_>.init_ & 1U) != 0) {
          uVar1 = *(ushort *)&arginfo->field_0x1;
          if ((((uVar1 & 0x10) != 0) &&
              ((local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->global != false)) ||
             ((uVar7 = 0x18, (uVar1 & 0x20) != 0 &&
              (uVar7 = 0x17,
              (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->global != true)))) {
            bVar4 = match_arg::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)
                               (ulong)(local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.
                                       value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->type,(shared_ptr<Var> *)(ulong)*(uint *)arginfo,
                               (Arg *)(ulong)uVar1);
            if (bVar4) {
              if (!bVar3) {
LAB_0016598f:
                __return_storage_ptr__->has_value = true;
                (__return_storage_ptr__->contained).m_value = arginfo;
                peVar6 = (element_type *)__return_storage_ptr__;
                goto LAB_00165c56;
              }
              if (((local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count).
                  super_OptionalBase<unsigned_int>.init_ != false) {
                if ((ulong)uVar9 <
                    (ulong)((local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count).
                           super_OptionalBase<unsigned_int>.storage_.value_) goto LAB_0016598f;
                peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (__shared_count<(__gnu_cxx::_Lock_policy)2>)
                     (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  __return_storage_ptr__->has_value = false;
                  (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
                  (__return_storage_ptr__->contained).m_error.context.
                  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  (__return_storage_ptr__->contained).m_error.reason = VariableIndexOutOfRange;
                  goto LAB_00165c56;
                }
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
                  UNLOCK();
                  if (__libc_single_threaded != '\0') goto LAB_00165c86;
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
LAB_00165c86:
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
                }
                __return_storage_ptr__->has_value = false;
                (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
                (__return_storage_ptr__->contained).m_error.context.
                super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                     super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
                (__return_storage_ptr__->contained).m_error.reason = VariableIndexOutOfRange;
                goto LAB_00165c51;
              }
              peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (__shared_count<(__gnu_cxx::_Lock_policy)2>)
                   (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                __return_storage_ptr__->has_value = false;
                (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
                (__return_storage_ptr__->contained).m_error.context.
                super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                (__return_storage_ptr__->contained).m_error.reason = VariableIsNotArray;
                goto LAB_00165c56;
              }
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _M_use_count + 1;
                UNLOCK();
                if (__libc_single_threaded != '\0') goto LAB_00165bb5;
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _M_use_count + 1;
LAB_00165bb5:
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _M_use_count + 1;
              }
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
              (__return_storage_ptr__->contained).m_error.context.
              super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              (__return_storage_ptr__->contained).m_error.reason = VariableIsNotArray;
              goto LAB_00165c51;
            }
            peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (__shared_count<(__gnu_cxx::_Lock_policy)2>)
                 (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
              (__return_storage_ptr__->contained).m_error.context.
              super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (__return_storage_ptr__->contained).m_error.reason = VariableTypeMismatch;
              goto LAB_00165c56;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_00165a62;
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
LAB_00165a62:
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (__return_storage_ptr__->contained).m_error.reason = VariableTypeMismatch;
            goto LAB_00165c51;
          }
          peVar6 = (element_type *)0x17;
          if ((uVar1 & 0x10) == 0) {
            peVar6 = (element_type *)(ulong)uVar7;
          }
          peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
          if (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_001659f2;
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
LAB_001659f2:
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (__return_storage_ptr__->contained).m_error.reason = (Reason)peVar6;
            goto LAB_00165c51;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (__return_storage_ptr__->contained).m_error.reason = (Reason)peVar6;
          goto LAB_00165c56;
        }
      }
      __function = 
      "T &std::experimental::optional<std::shared_ptr<Var>>::operator*() & [T = std::shared_ptr<Var>]"
      ;
LAB_00165d45:
      __assert_fail("initialized()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                    ,0x204,__function);
    }
    if (local_50[0] == false) {
      __assert_fail("initialized()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                    ,0x1fb,
                    "T *std::experimental::optional<std::pair<libcxx_strviewclone::basic_string_view<char>, bool>>::operator->() [T = std::pair<libcxx_strviewclone::basic_string_view<char>, bool>]"
                   );
    }
    if ((bool)local_50[0x18] != true) goto LAB_00165448;
    peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = ExpectedVar;
      goto LAB_00165c56;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
      super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
           super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_001657ca;
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
      super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
           super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
      super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
           super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
LAB_001657ca:
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
      super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
           super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedVar;
LAB_00165c51:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_b8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    peVar6 = extraout_RAX_02;
LAB_00165c56:
    if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.init_ != true) {
      return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
    }
    if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
    }
    goto LAB_001654ab;
  }
LAB_00165448:
  peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
      super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->contained).m_error.reason = NoSuchVar;
    return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_00165496;
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
LAB_00165496:
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
  }
  __return_storage_ptr__->has_value = false;
  (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
  (__return_storage_ptr__->contained).m_error.context.
  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->contained).m_error.reason = NoSuchVar;
LAB_001654ab:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  return extraout_RAX_00;
switchD_0016539d_caseD_0:
  peVar6 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
      super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->contained).m_error.reason = InvalidIdentifier;
    return (expected<const_Command::Arg_*,_Commands::MatchFailure> *)peVar6;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0016577c;
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
LAB_0016577c:
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count + 1;
  }
  __return_storage_ptr__->has_value = false;
  (__return_storage_ptr__->contained).m_value = (value_type)peVar6;
  (__return_storage_ptr__->contained).m_error.context.
  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_d0.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->contained).m_error.reason = InvalidIdentifier;
  goto LAB_001654ab;
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      const TagVar& arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    auto var_matches = [](const shared_ptr<Var>& var, const Command::Arg& arginfo) -> bool
    {
        switch(var->type)
        {
            case VarType::Int:
                return (arginfo.type == ArgType::Integer
                     || arginfo.type == ArgType::Constant 
                     || arginfo.type == ArgType::Param 
                     || (arginfo.type == ArgType::String && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel16 && arginfo.allow_pointer));
            case VarType::Float:
                return (arginfo.type == ArgType::Float || arginfo.type == ArgType::Param);
            case VarType::TextLabel:
                return (arginfo.type == ArgType::TextLabel
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            case VarType::TextLabel16:
                return (arginfo.type == ArgType::TextLabel16
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            default:
                Unreachable();
        }
    };

    if(!Miss2Identifier::is_identifier(arg.ident, options))
        return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });

    if(auto var_ident = maybe_var_identifier(arg.ident, arginfo))
    {
        auto opt_token = Miss2Identifier::match(var_ident->first, options);
        if(!opt_token)
        {
            switch(opt_token.error())
            {
                case Miss2Identifier::InvalidIdentifier:return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });
                case Miss2Identifier::NestingOfArrays:  return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNesting });
                case Miss2Identifier::NegativeIndex:    return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNegative });
                case Miss2Identifier::OutOfRange:       return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexOutOfRange });
                default:                                Unreachable();
            }
        }

        auto& token = *opt_token;
        if(auto opt_var = symtable.find_var(token.identifier, scope_ptr))
        {
            optional<size_t> indexing;

            if(token.index != nullopt && is<size_t>(*token.index))
            {
                indexing = get<size_t>(*token.index);
            }
            if(token.index != nullopt && !is<size_t>(*token.index))
            {
                auto& index = get<string_view>(*token.index);
                if(auto opt_varidx = symtable.find_var(index, scope_ptr))
                {
                    if((*opt_varidx)->type != VarType::Int)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotInt });
                    if((*opt_varidx)->count)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsArray });
                }
                else if(auto opt_const = commands.find_constant_all(index))
                {
                    indexing = *opt_const;
                    if(options.pedantic) // TODO pedantic/warning instead of error
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsConstant });
                }
                else
                {
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotVar });
                }
            }
            else if(token.index == nullopt && (*opt_var)->count != nullopt)
            {
                return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVarIndex });
            }

            auto& var = *opt_var;
            if(!(arginfo.allow_global_var && var->global) && !(arginfo.allow_local_var && !var->global))
            {
                auto failure = arginfo.allow_global_var || arginfo.allow_local_var? MatchFailure::VariableKindNotAllowed :
                                                                                    MatchFailure::VariableNotAllowed;
                return make_unexpected(MatchFailure{ hint, failure });
            }

            if(!var_matches(var, arginfo))
                return make_unexpected(MatchFailure{ hint, MatchFailure::VariableTypeMismatch });

            if(indexing)
            {
                if(var->count == nullopt)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIsNotArray });
                else if(*indexing >= *var->count)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexOutOfRange });
            }

            return &arginfo;
        }
        else if(var_ident->second) // var not found, but required to find one?
        {
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVar });
        }
    }

    return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchVar });
}